

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggressive_dead_code_elim_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::AggressiveDCEPass::AddOperandsToWorkList(AggressiveDCEPass *this,Instruction *inst)

{
  uint32_t uVar1;
  DefUseManager *this_00;
  Instruction *inst_00;
  anon_class_8_1_8991fb9c local_40;
  function<void_(const_unsigned_int_*)> local_38;
  Instruction *local_18;
  Instruction *inst_local;
  AggressiveDCEPass *this_local;
  
  local_40.this = this;
  local_18 = inst;
  inst_local = (Instruction *)this;
  std::function<void(unsigned_int_const*)>::
  function<spvtools::opt::AggressiveDCEPass::AddOperandsToWorkList(spvtools::opt::Instruction_const*)::__0,void>
            ((function<void(unsigned_int_const*)> *)&local_38,&local_40);
  opt::Instruction::ForEachInId(inst,&local_38);
  std::function<void_(const_unsigned_int_*)>::~function(&local_38);
  uVar1 = opt::Instruction::type_id(local_18);
  if (uVar1 != 0) {
    this_00 = Pass::get_def_use_mgr((Pass *)this);
    uVar1 = opt::Instruction::type_id(local_18);
    inst_00 = analysis::DefUseManager::GetDef(this_00,uVar1);
    AddToWorklist(this,inst_00);
  }
  return;
}

Assistant:

void AggressiveDCEPass::AddOperandsToWorkList(const Instruction* inst) {
  inst->ForEachInId([this](const uint32_t* iid) {
    Instruction* inInst = get_def_use_mgr()->GetDef(*iid);
    AddToWorklist(inInst);
  });
  if (inst->type_id() != 0) {
    AddToWorklist(get_def_use_mgr()->GetDef(inst->type_id()));
  }
}